

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

Session * __thiscall SessionManager::getSession(SessionManager *this,CK_SESSION_HANDLE hSession)

{
  MutexLocker *pMVar1;
  reference ppSVar2;
  MutexLocker *in_RSI;
  long in_RDI;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffffb8;
  MutexLocker *in_stack_ffffffffffffffc0;
  value_type local_8;
  
  MutexLocker::MutexLocker(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_RSI == (MutexLocker *)0x0) {
    local_8 = (value_type)0x0;
  }
  else {
    in_stack_ffffffffffffffc0 = in_RSI;
    pMVar1 = (MutexLocker *)
             std::vector<Session_*,_std::allocator<Session_*>_>::size
                       ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8));
    if (pMVar1 < in_stack_ffffffffffffffc0) {
      local_8 = (value_type)0x0;
    }
    else {
      ppSVar2 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                          ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),
                           (size_type)((long)&in_RSI[-1].mutex + 7));
      local_8 = *ppSVar2;
    }
  }
  MutexLocker::~MutexLocker(in_stack_ffffffffffffffc0);
  return local_8;
}

Assistant:

Session* SessionManager::getSession(CK_SESSION_HANDLE hSession)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// We do not want to get a negative number below
	if (hSession == CK_INVALID_HANDLE) return NULL;

	// Check if we are out of range
	if (hSession > sessions.size()) return NULL;

	return sessions[hSession - 1];
}